

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void __thiscall deqp::gls::FboUtil::FboBuilder::~FboBuilder(FboBuilder *this)

{
  Texture *cfg;
  Renderbuffer *cfg_00;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  reference ppCVar4;
  _Self local_70;
  _Self local_68;
  const_iterator it_2;
  iterator local_58;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>
  local_50;
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>
  local_40;
  const_iterator it_1;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>
  local_28;
  iterator local_20;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>
  local_18;
  const_iterator it;
  FboBuilder *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>_>
       ::begin(&(this->super_Framebuffer).textures);
  std::
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>
  ::_Rb_tree_const_iterator(&local_18,&local_20);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>_>
         ::end(&(this->super_Framebuffer).textures);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>
    ::_Rb_tree_const_iterator(&local_28,&local_30);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>
             ::operator->(&local_18);
    cfg = ppVar2->second;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>
             ::operator->(&local_18);
    FboUtil::config::glDelete(&cfg->super_Image,ppVar2->first,this->m_gl);
    it_1._M_node = (_Base_ptr)
                   std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Texture_*>_>
                   ::operator++(&local_18,0);
  }
  local_48._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>_>
       ::begin(&(this->super_Framebuffer).rbos);
  std::
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>
  ::_Rb_tree_const_iterator(&local_40,&local_48);
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>_>
         ::end(&(this->super_Framebuffer).rbos);
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>
    ::_Rb_tree_const_iterator(&local_50,&local_58);
    bVar1 = std::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>
             ::operator->(&local_40);
    cfg_00 = ppVar3->second;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>
             ::operator->(&local_40);
    FboUtil::config::glDelete(&cfg_00->super_Image,ppVar3->first,this->m_gl);
    it_2._M_node = (_Base_ptr)
                   std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Renderbuffer_*>_>
                   ::operator++(&local_40,0);
  }
  (*this->m_gl->bindFramebuffer)(this->m_target,0);
  local_68._M_node =
       (_Base_ptr)
       std::
       set<deqp::gls::FboUtil::config::Config_*,_std::less<deqp::gls::FboUtil::config::Config_*>,_std::allocator<deqp::gls::FboUtil::config::Config_*>_>
       ::begin(&this->m_configs);
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         std::
         set<deqp::gls::FboUtil::config::Config_*,_std::less<deqp::gls::FboUtil::config::Config_*>,_std::allocator<deqp::gls::FboUtil::config::Config_*>_>
         ::end(&this->m_configs);
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    ppCVar4 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::config::Config_*>::operator*
                        (&local_68);
    if (*ppCVar4 != (Config *)0x0) {
      (*(*ppCVar4)->_vptr_Config[1])();
    }
    std::_Rb_tree_const_iterator<deqp::gls::FboUtil::config::Config_*>::operator++(&local_68,0);
  }
  std::
  set<deqp::gls::FboUtil::config::Config_*,_std::less<deqp::gls::FboUtil::config::Config_*>,_std::allocator<deqp::gls::FboUtil::config::Config_*>_>
  ::~set(&this->m_configs);
  FboUtil::config::Framebuffer::~Framebuffer(&this->super_Framebuffer);
  return;
}

Assistant:

FboBuilder::~FboBuilder (void)
{
	for (TextureMap::const_iterator it = textures.begin(); it != textures.end(); it++)
	{
		glDelete(*it->second, it->first, m_gl);
	}
	for (RboMap::const_iterator it = rbos.begin(); it != rbos.end(); it++)
	{
		glDelete(*it->second, it->first, m_gl);
	}
	m_gl.bindFramebuffer(m_target, 0);
	for (Configs::const_iterator it = m_configs.begin(); it != m_configs.end(); it++)
	{
		delete *it;
	}
}